

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  _Alloc_hider str;
  bool bVar1;
  wchar_t **ppwVar2;
  int iVar3;
  wchar_t **in_RDX;
  wchar_t **extraout_RDX;
  string *str_00;
  int iVar4;
  string arg_string;
  
  iVar4 = 1;
  str_00 = (string *)argc;
  do {
    if (*argc <= iVar4) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str_00);
      }
      return;
    }
    StreamableToString<wchar_t*>(&arg_string,(internal *)(argv + iVar4),in_RDX);
    str = arg_string._M_dataplus;
    bVar1 = ParseGoogleTestFlag(arg_string._M_dataplus._M_p);
    if (bVar1) {
LAB_00346566:
      ppwVar2 = argv + (long)iVar4 + 1;
      iVar3 = iVar4;
      while( true ) {
        if (iVar3 == *argc) break;
        ppwVar2[-1] = *ppwVar2;
        ppwVar2 = ppwVar2 + 1;
        iVar3 = iVar3 + 1;
      }
      *argc = *argc + -1;
      iVar4 = iVar4 + -1;
    }
    else {
      bVar1 = ParseStringFlag(str._M_p,"flagfile",(string *)&FLAGS_gtest_flagfile_abi_cxx11_);
      if (bVar1) {
        LoadFlagsFromFile((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
        goto LAB_00346566;
      }
      bVar1 = std::operator==(&arg_string,"--help");
      if (bVar1) {
LAB_003465e9:
        g_help_flag = '\x01';
      }
      else {
        bVar1 = std::operator==(&arg_string,"-h");
        if (bVar1) goto LAB_003465e9;
        bVar1 = std::operator==(&arg_string,"-?");
        if (bVar1) goto LAB_003465e9;
        bVar1 = std::operator==(&arg_string,"/?");
        if (bVar1) goto LAB_003465e9;
        bVar1 = HasGoogleTestFlagPrefix((char *)0x3465e5);
        if (bVar1) goto LAB_003465e9;
      }
    }
    str_00 = &arg_string;
    std::__cxx11::string::~string((string *)&arg_string);
    iVar4 = iVar4 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}